

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmltosmf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  _Ios_Openmode __a;
  char *pcVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  size_type sVar4;
  ostream *this;
  void *this_00;
  runtime_error *this_01;
  uchar *puVar5;
  exception *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  string errorWord;
  string msg;
  size_t lineNumber;
  Exception *e_1;
  fstream fs;
  path path;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fileImage;
  Smf smf;
  string mml;
  variables_map vm;
  positional_options_description pd;
  options_description desc;
  string output;
  string input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  openmode in_stack_fffffffffffff924;
  path *in_stack_fffffffffffff928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff930;
  allocator<char> *in_stack_fffffffffffff950;
  undefined7 in_stack_fffffffffffff958;
  undefined1 in_stack_fffffffffffff95f;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  char **in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff988;
  int argc_00;
  basic_command_line_parser<char> *in_stack_fffffffffffff990;
  basic_command_line_parser<char> *in_stack_fffffffffffff998;
  undefined1 local_570 [16];
  char local_560 [56];
  Smf *in_stack_fffffffffffffad8;
  string *in_stack_fffffffffffffba8;
  anon_class_8_1_a81546ea *in_stack_fffffffffffffbb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_338 [2];
  string *local_300;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0 [32];
  int local_2b0;
  allocator<char> local_2a9;
  string local_2a8 [152];
  basic_parsed_options local_210 [40];
  variables_map local_1e8 [160];
  positional_options_description local_148 [56];
  undefined8 local_110 [3];
  allocator<char> local_f1;
  string local_f0 [32];
  options_description local_d0 [128];
  string local_50 [32];
  string local_30 [44];
  int local_4;
  
  argc_00 = (int)((ulong)in_stack_fffffffffffff988 >> 0x20);
  local_4 = 0;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             (char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950);
  boost::program_options::options_description::options_description
            (local_d0,local_f0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_110[0] = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_110,"version");
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar2,"help");
  ptVar3 = boost::program_options::value<std::__cxx11::string>(in_stack_fffffffffffff930);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar3);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"input,i",(char *)ptVar3);
  ptVar3 = boost::program_options::value<std::__cxx11::string>(in_stack_fffffffffffff930);
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar3);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"output,o",(char *)ptVar3);
  boost::program_options::positional_options_description::positional_options_description(local_148);
  boost::program_options::variables_map::variables_map(local_1e8);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            (in_stack_fffffffffffff990,argc_00,in_stack_fffffffffffff980);
  boost::program_options::basic_command_line_parser<char>::options
            ((basic_command_line_parser<char> *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             (options_description *)in_stack_fffffffffffff918);
  boost::program_options::basic_command_line_parser<char>::positional
            ((basic_command_line_parser<char> *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             (positional_options_description *)in_stack_fffffffffffff918);
  boost::program_options::basic_command_line_parser<char>::run(in_stack_fffffffffffff998);
  boost::program_options::store(local_210,local_1e8,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x110592);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)0x11059f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             (char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
             in_stack_fffffffffffff950);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)in_stack_fffffffffffff930,&in_stack_fffffffffffff928->_M_pathname);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  if (sVar4 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               (char *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),
               in_stack_fffffffffffff950);
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)in_stack_fffffffffffff930,&in_stack_fffffffffffff928->_M_pathname);
    std::__cxx11::string::~string(local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    if (sVar4 == 0) {
      boost::program_options::notify(local_1e8);
      local_300 = local_30;
      main::$_0::operator()[abi_cxx11_(in_stack_fffffffffffffbb8);
      rlib::sequencer::mmlToSmf(in_stack_fffffffffffffba8);
      rlib::midi::Smf::getFileImage(in_stack_fffffffffffffad8);
      std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
                (in_stack_fffffffffffff918);
      __a = std::operator|(_S_out,_S_bin);
      std::operator|(__a,_S_trunc);
      std::fstream::fstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                ((basic_fstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff930,
                 in_stack_fffffffffffff928,in_stack_fffffffffffff924);
      bVar1 = std::ios::fail();
      if ((bVar1 & 1) != 0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"output file open error.");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x110a8a);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_338);
      std::ostream::write(local_560,(long)puVar5);
      std::fstream::~fstream(local_570);
      std::filesystem::__cxx11::path::~path
                ((path *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff930)
      ;
      rlib::midi::Smf::~Smf((Smf *)0x110ae1);
      std::__cxx11::string::~string(local_2f8);
      local_2b0 = 0;
    }
    else {
      this_00 = (void *)boost::program_options::operator<<((ostream *)&std::cout,local_d0);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
      local_2b0 = 1;
    }
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"mmltosmf version 1.2.3");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_2b0 = 1;
  }
  boost::program_options::variables_map::~variables_map
            ((variables_map *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  boost::program_options::positional_options_description::~positional_options_description
            ((positional_options_description *)
             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  boost::program_options::options_description::~options_description
            ((options_description *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (local_2b0 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(const int argc, const char* const argv[])
{
	namespace po = boost::program_options;

	try {
		std::string input, output;
		po::options_description desc("options");
		desc.add_options()
			("version", "show version")
			("help", "show help")
			("input,i", po::value(&input)->required(), "input file (required)")		// 入力ファイルパス(mml)
			("output,o", po::value(&output)->required(), "output file (required)")	// 出力ファイル(mid)
			;

		po::positional_options_description pd;
		// pd.add("input", -1);

		po::variables_map vm;
		po::store(po::command_line_parser(argc, argv).options(desc).positional(pd).run(), vm);

		if (vm.count("version")) {
			std::cout << "mmltosmf version 1.2.3" << std::endl;
			return 0;
		}

		if (vm.count("help")) {
			std::cout << desc << std::endl;		// ヘルプ表示
			return 0;
		}

		po::notify(vm);

		const std::string mml = [&] {
			auto path = std::filesystem::u8path(input);
			std::fstream fs(path, std::ios::in | std::ios::binary);
			if (fs.fail()) {
				throw std::runtime_error("input file open error.");
			}
			const std::istreambuf_iterator<char> begin(fs);
			return std::string(begin, std::istreambuf_iterator<char>());
		}();

		try {
			const midi::Smf smf = sequencer::mmlToSmf(mml);
			auto fileImage = smf.getFileImage();

			auto path = std::filesystem::u8path(output);
			std::fstream fs(path, std::ios::out | std::ios::binary | std::ios::trunc);
			if (fs.fail()) {
				throw std::runtime_error("output file open error.");
			}
			fs.write(reinterpret_cast<const char* const>(fileImage.data()), fileImage.size());

		} catch (const sequencer::MmlCompiler::Exception& e) {

			const size_t lineNumber = [&] {	// 行番号取得
				static const std::regex re(R"(\r\n|\n|\r)");
				size_t lf = 0;
				for (auto i = std::sregex_token_iterator(mml.cbegin(), e.it, re, -1); i != std::sregex_token_iterator(); i++) lf++;
				return lf;
			}();
			const auto msg = sequencer::MmlCompiler::Exception::getMessage(e.code);	// エラーメッセージ取得
			auto errorWord = [&] {
				std::string s(e.errorWord);
				std::smatch m;
				if (std::regex_search(s, m, std::regex(R"(\r\n|\n|\r)"))) {
					s = std::string(s.cbegin(), m[0].first);
				}
				return s;
			}();

			const auto s = string::format(R"(line %d %s : %s)", lineNumber, errorWord, msg);
			throw std::runtime_error(s);
		}

	} catch (std::exception& e) {
		std::cerr << e.what() << std::endl;
		return 1;
	}

	return 0;
}